

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O1

void __thiscall
TPZGenPartialGrid::TPZGenPartialGrid
          (TPZGenPartialGrid *this,TPZVec<int> *nx,TPZVec<int> *rangex,TPZVec<int> *rangey,
          TPZVec<double> *x0,TPZVec<double> *x1)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  double *pdVar6;
  
  TPZVec<int>::TPZVec(&this->fNx,nx);
  (this->fRangex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fRangex).fStore = (int *)0x0;
  (this->fRangex).fNElements = 0;
  (this->fRangex).fNAlloc = 0;
  (this->fRangey)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fRangey).fStore = (int *)0x0;
  (this->fRangey).fNElements = 0;
  (this->fRangey).fNAlloc = 0;
  TPZVec<double>::TPZVec(&this->fX0,x0);
  TPZVec<double>::TPZVec(&this->fX1,x1);
  TPZVec<double>::TPZVec(&this->fDelx,2);
  pdVar3 = x1->fStore;
  pdVar4 = x0->fStore;
  piVar5 = nx->fStore;
  iVar1 = *piVar5;
  pdVar6 = (this->fDelx).fStore;
  *pdVar6 = (*pdVar3 - *pdVar4) / (double)iVar1;
  iVar2 = piVar5[1];
  pdVar6[1] = (pdVar3[1] - pdVar4[1]) / (double)iVar2;
  this->fNumNodes = (long)((iVar2 + 1) * (iVar1 + 1));
  this->fElementType = 0;
  TPZVec<int>::operator=(&this->fRangex,rangex);
  TPZVec<int>::operator=(&this->fRangey,rangey);
  return;
}

Assistant:

TPZGenPartialGrid::TPZGenPartialGrid(TPZVec<int> &nx, TPZVec<int> &rangex, TPZVec<int> &rangey, TPZVec<REAL> &x0,TPZVec<REAL> &x1) : fNx(nx), fX0(x0), fX1(x1),
fDelx(2)
{
	fDelx[0] = (x1[0]-x0[0])/(nx[0]);
	fDelx[1] = (x1[1]-x0[1])/(nx[1]);
	fNumNodes= (nx[0]+1)*(nx[1]+1);
	fElementType = 0;
	fRangex = rangex;
	fRangey = rangey;
}